

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O2

AssertionResult * __thiscall
iutest::internal::
CmpHelperEQ<int,iutest::detail::peep::Peep<test::prod_test::ProdClass2,test::prod_test::iu_peep_tag_m_x<test::prod_test::ProdClass2>>::peep_member_object_impl<test::prod_test::ProdClass2,int,false>>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expected_str,
          char *actual_str,int *expected,
          peep_member_object_impl<test::prod_test::ProdClass2,_int,_false> *actual)

{
  peep_member_object_impl<test::prod_test::ProdClass2,_int,_false> *v;
  string local_60;
  string local_40;
  
  if (*(int *)(*(long *)expected +
              detail::peep_tag<test::prod_test::iu_peep_tag_m_x<test::prod_test::ProdClass2>>::value
              ) == *(int *)actual_str) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    PrintToString<int>(&local_40,(int *)actual_str);
    PrintToString<iutest::detail::peep::Peep<test::prod_test::ProdClass2,test::prod_test::iu_peep_tag_m_x<test::prod_test::ProdClass2>>::peep_member_object_impl<test::prod_test::ProdClass2,int,false>>
              (&local_60,(iutest *)expected,v);
    EqFailure(__return_storage_ptr__,(char *)this,expected_str,&local_40,&local_60,false);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( iuOperatorEQ(actual, expected) )
    {
        return AssertionSuccess();
    }